

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ComputeShape
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZVec<double> *qsi,TPZMaterialData *data)

{
  int iVar1;
  uint uVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  ulong uVar5;
  TPZFMatrix<double> phiMaster;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> local_1a0;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 600))();
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_1a0.fElem = (double *)0x0;
  local_1a0.fGiven = (double *)0x0;
  local_1a0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1a0.fWork.fStore = (double *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  if (this->fhdivfam == EHDivConstant) {
    TPZFMatrix<double>::Resize(&local_1a0,1,(long)iVar1);
    TPZFMatrix<double>::Resize(&(data->divphi).super_TPZFMatrix<double>,(long)iVar1,1);
    TPZShapeHDivConstant<pzshape::TPZShapeLinear>::Shape
              (qsi,&data->super_TPZShapeData,&local_1a0,&(data->divphi).super_TPZFMatrix<double>);
  }
  else {
    if (this->fhdivfam != EHDivStandard) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
                 ,0x369);
    }
    TPZShapeHDiv<pzshape::TPZShapeLinear>::Shape
              (qsi,&data->super_TPZShapeData,&local_1a0,&(data->divphi).super_TPZFMatrix<double>);
  }
  uVar2 = (uint)(data->divphi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow;
  if (0 < (int)uVar2) {
    plVar4 = &((data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore)->second;
    uVar5 = 0;
    do {
      ((pair<int,_long> *)(plVar4 + -1))->first = (int)uVar5;
      *plVar4 = uVar5;
      uVar5 = uVar5 + 1;
      plVar4 = plVar4 + 2;
    } while ((uVar2 & 0x7fffffff) != uVar5);
  }
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar3 + 0x230))(pTVar3,qsi,&local_110);
  TPZFMatrix<double>::MultAdd
            (&local_110,&local_1a0,&(data->fDeformedDirections).super_TPZFMatrix<double>,
             &(data->fDeformedDirections).super_TPZFMatrix<double>,1.0 / ABS(data->detjac),0.0,0);
  TPZFMatrix<double>::operator*=(&(data->divphi).super_TPZFMatrix<double>,1.0 / ABS(data->detjac));
  TPZFMatrix<double>::operator=(&(data->phi).super_TPZFMatrix<double>,1.0);
  TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_1a0);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data) {

    constexpr int dim = TSHAPE::Dimension;
    const int nshape = this->NShapeF();
    TPZShapeData &shapedata = data;
    TPZFMatrix<REAL> phiMaster;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    case HDivFamily::EHDivConstant:
        phiMaster.Resize(TSHAPE::Dimension,nshape);
        data.divphi.Resize(nshape,1);
        TPZShapeHDivConstant<TSHAPE>::Shape(qsi, shapedata, phiMaster, data.divphi);
        break;

    default:
        DebugStop();
        break;
    }

    //This is for legacy material classes - will be deleted in the future
    int shapeSize = data.divphi.Rows();

    for (int i = 0; i < shapeSize; i++){
        data.fVecShapeIndex[i] = make_pair(i,i);
    }
    //
    
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    this->Reference()->GradX(qsi, gradx);
    gradx.MultAdd(phiMaster,data.fDeformedDirections,data.fDeformedDirections,1./fabs(data.detjac));
    data.divphi *= 1/fabs(data.detjac);
    data.phi = 1.;

}